

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O3

void __thiscall
cbtCollisionWorld::convexSweepTest
          (cbtCollisionWorld *this,cbtConvexShape *castShape,cbtTransform *convexFromWorld,
          cbtTransform *convexToWorld,ConvexResultCallback *resultCallback,
          cbtScalar allowedCcdPenetration)

{
  undefined1 auVar1 [16];
  CProfileSample __profile;
  cbtScalar angle;
  cbtVector3 angVel;
  cbtVector3 castShapeAabbMax;
  cbtVector3 castShapeAabbMin;
  cbtSingleSweepCallback convexCB;
  cbtTransform convexFromTrans;
  cbtTransform convexToTrans;
  CProfileSample local_1ed;
  cbtScalar local_1ec;
  cbtQuaternion local_1e8;
  cbtVector3 local_1d8;
  cbtVector3 local_1c0;
  cbtVector3 local_1b0;
  cbtVector3 local_1a0;
  undefined1 local_190 [8];
  float fStack_188;
  cbtScalar acStack_184 [2];
  cbtScalar local_17c;
  cbtScalar local_178 [4];
  cbtScalar local_168;
  cbtScalar local_164 [4];
  cbtScalar local_154;
  cbtQuaternion local_b8;
  cbtTransform local_a8;
  cbtTransform local_68;
  
  local_1ec = allowedCcdPenetration;
  CProfileSample::CProfileSample(&local_1ed,"convexSweepTest");
  local_a8.m_basis.m_el[0].m_floats._0_8_ =
       *(undefined8 *)(convexFromWorld->m_basis).m_el[0].m_floats;
  local_a8.m_basis.m_el[0].m_floats._8_8_ =
       *(undefined8 *)((convexFromWorld->m_basis).m_el[0].m_floats + 2);
  local_a8.m_basis.m_el[1].m_floats._0_8_ =
       *(undefined8 *)(convexFromWorld->m_basis).m_el[1].m_floats;
  local_a8.m_basis.m_el[1].m_floats._8_8_ =
       *(undefined8 *)((convexFromWorld->m_basis).m_el[1].m_floats + 2);
  local_a8.m_basis.m_el[2].m_floats._0_8_ =
       *(undefined8 *)(convexFromWorld->m_basis).m_el[2].m_floats;
  local_a8.m_basis.m_el[2].m_floats._8_8_ =
       *(undefined8 *)((convexFromWorld->m_basis).m_el[2].m_floats + 2);
  local_a8.m_origin.m_floats._0_8_ = *(undefined8 *)(convexFromWorld->m_origin).m_floats;
  local_a8.m_origin.m_floats._8_8_ = *(undefined8 *)((convexFromWorld->m_origin).m_floats + 2);
  local_68.m_basis.m_el[0].m_floats._0_8_ = *(undefined8 *)(convexToWorld->m_basis).m_el[0].m_floats
  ;
  local_68.m_basis.m_el[0].m_floats._8_8_ =
       *(undefined8 *)((convexToWorld->m_basis).m_el[0].m_floats + 2);
  local_68.m_basis.m_el[1].m_floats._0_8_ = *(undefined8 *)(convexToWorld->m_basis).m_el[1].m_floats
  ;
  local_68.m_basis.m_el[1].m_floats._8_8_ =
       *(undefined8 *)((convexToWorld->m_basis).m_el[1].m_floats + 2);
  local_68.m_basis.m_el[2].m_floats._0_8_ = *(undefined8 *)(convexToWorld->m_basis).m_el[2].m_floats
  ;
  local_68.m_basis.m_el[2].m_floats._8_8_ =
       *(undefined8 *)((convexToWorld->m_basis).m_el[2].m_floats + 2);
  local_68.m_origin.m_floats._0_8_ = *(undefined8 *)(convexToWorld->m_origin).m_floats;
  local_68.m_origin.m_floats._8_8_ = *(undefined8 *)((convexToWorld->m_origin).m_floats + 2);
  cbtTransformUtil::calculateDiffAxisAngle
            (&local_a8,&local_68,(cbtVector3 *)local_190,(cbtScalar *)&local_1e8);
  auVar1._0_4_ = local_1e8.super_cbtQuadWord.m_floats[0] * (float)local_190._0_4_;
  auVar1._4_4_ = local_1e8.super_cbtQuadWord.m_floats[0] * (float)local_190._4_4_;
  auVar1._8_4_ = local_1e8.super_cbtQuadWord.m_floats[0] * 0.0;
  auVar1._12_4_ = local_1e8.super_cbtQuadWord.m_floats[0] * 0.0;
  local_190._0_4_ = 1.0;
  local_1c0.m_floats =
       (cbtScalar  [4])
       vinsertps_avx(auVar1,ZEXT416((uint)(local_1e8.super_cbtQuadWord.m_floats[0] * fStack_188)),
                     0x28);
  local_1d8.m_floats = (cbtScalar  [4])(ZEXT816(0) << 0x20);
  local_190._4_4_ = 0.0;
  fStack_188 = 0.0;
  acStack_184 = SUB168(ZEXT816(0),4);
  local_17c = 1.0;
  local_168 = 1.0;
  local_154 = 0.0;
  local_178 = local_1d8.m_floats;
  local_164 = local_1d8.m_floats;
  cbtMatrix3x3::getRotation(&local_a8.m_basis,&local_1e8);
  local_b8.super_cbtQuadWord.m_floats[2] = local_1e8.super_cbtQuadWord.m_floats[2];
  local_b8.super_cbtQuadWord.m_floats[3] = local_1e8.super_cbtQuadWord.m_floats[3];
  cbtMatrix3x3::setRotation((cbtMatrix3x3 *)local_190,&local_b8);
  cbtCollisionShape::calculateTemporalAabb
            (&castShape->super_cbtCollisionShape,(cbtTransform *)local_190,&local_1d8,&local_1c0,1.0
             ,&local_1a0,&local_1b0);
  cbtSingleSweepCallback::cbtSingleSweepCallback
            ((cbtSingleSweepCallback *)local_190,castShape,convexFromWorld,convexToWorld,this,
             resultCallback,local_1ec);
  (*this->m_broadphasePairCache->_vptr_cbtBroadphaseInterface[6])
            (this->m_broadphasePairCache,&local_a8.m_origin,&local_68.m_origin,local_190,&local_1a0,
             &local_1b0);
  CProfileSample::~CProfileSample(&local_1ed);
  return;
}

Assistant:

void cbtCollisionWorld::convexSweepTest(const cbtConvexShape* castShape, const cbtTransform& convexFromWorld, const cbtTransform& convexToWorld, ConvexResultCallback& resultCallback, cbtScalar allowedCcdPenetration) const
{
	BT_PROFILE("convexSweepTest");
	/// use the broadphase to accelerate the search for objects, based on their aabb
	/// and for each object with ray-aabb overlap, perform an exact ray test
	/// unfortunately the implementation for rayTest and convexSweepTest duplicated, albeit practically identical

	cbtTransform convexFromTrans, convexToTrans;
	convexFromTrans = convexFromWorld;
	convexToTrans = convexToWorld;
	cbtVector3 castShapeAabbMin, castShapeAabbMax;
	/* Compute AABB that encompasses angular movement */
	{
		cbtVector3 linVel, angVel;
		cbtTransformUtil::calculateVelocity(convexFromTrans, convexToTrans, 1.0f, linVel, angVel);
		cbtVector3 zeroLinVel;
		zeroLinVel.setValue(0, 0, 0);
		cbtTransform R;
		R.setIdentity();
		R.setRotation(convexFromTrans.getRotation());
		castShape->calculateTemporalAabb(R, zeroLinVel, angVel, 1.0f, castShapeAabbMin, castShapeAabbMax);
	}

#ifndef USE_BRUTEFORCE_RAYBROADPHASE

	cbtSingleSweepCallback convexCB(castShape, convexFromWorld, convexToWorld, this, resultCallback, allowedCcdPenetration);

	m_broadphasePairCache->rayTest(convexFromTrans.getOrigin(), convexToTrans.getOrigin(), convexCB, castShapeAabbMin, castShapeAabbMax);

#else
	/// go over all objects, and if the ray intersects their aabb + cast shape aabb,
	// do a ray-shape query using convexCaster (CCD)
	int i;
	for (i = 0; i < m_collisionObjects.size(); i++)
	{
		cbtCollisionObject* collisionObject = m_collisionObjects[i];
		//only perform raycast if filterMask matches
		if (resultCallback.needsCollision(collisionObject->getBroadphaseHandle()))
		{
			//RigidcollisionObject* collisionObject = ctrl->GetRigidcollisionObject();
			cbtVector3 collisionObjectAabbMin, collisionObjectAabbMax;
			collisionObject->getCollisionShape()->getAabb(collisionObject->getWorldTransform(), collisionObjectAabbMin, collisionObjectAabbMax);
			AabbExpand(collisionObjectAabbMin, collisionObjectAabbMax, castShapeAabbMin, castShapeAabbMax);
			cbtScalar hitLambda = cbtScalar(1.);  //could use resultCallback.m_closestHitFraction, but needs testing
			cbtVector3 hitNormal;
			if (cbtRayAabb(convexFromWorld.getOrigin(), convexToWorld.getOrigin(), collisionObjectAabbMin, collisionObjectAabbMax, hitLambda, hitNormal))
			{
				objectQuerySingle(castShape, convexFromTrans, convexToTrans,
								  collisionObject,
								  collisionObject->getCollisionShape(),
								  collisionObject->getWorldTransform(),
								  resultCallback,
								  allowedCcdPenetration);
			}
		}
	}
#endif  //USE_BRUTEFORCE_RAYBROADPHASE
}